

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

bool __thiscall ExecutorX86::RemoveBreakpoint(ExecutorX86 *this,uint instruction)

{
  FastVector<ExecutorX86::Breakpoint,_false,_false> *this_00;
  uchar uVar1;
  Breakpoint *pBVar2;
  uchar **ppuVar3;
  uint index;
  uint i;
  uint index_00;
  
  if ((this->instAddress).count < instruction) {
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
  }
  else {
    this_00 = &this->breakInstructions;
    index_00 = 0;
    index = 0xffffffff;
    while ((index_00 < (this->breakInstructions).count && (index == 0xffffffff))) {
      pBVar2 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[](this_00,index_00);
      index = 0xffffffff;
      if (pBVar2->instIndex == instruction) {
        index = index_00;
      }
      index_00 = index_00 + 1;
    }
    if (index != 0xffffffff) {
      pBVar2 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[](this_00,index);
      ppuVar3 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (&this->instAddress,pBVar2->instIndex);
      if (**ppuVar3 == 0xcc) {
        pBVar2 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[](this_00,index);
        uVar1 = pBVar2->oldOpcode;
        pBVar2 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[](this_00,index);
        ppuVar3 = FastVector<unsigned_char_*,_false,_false>::operator[]
                            (&this->instAddress,pBVar2->instIndex);
        **ppuVar3 = uVar1;
        return true;
      }
    }
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,
                       "ERROR: there is no breakpoint at instruction %d",(ulong)instruction);
  }
  this->execErrorMessage = this->execErrorBuffer;
  return false;
}

Assistant:

bool ExecutorX86::RemoveBreakpoint(unsigned int instruction)
{
	if(instruction > instAddress.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	unsigned index = ~0u;
	for(unsigned i = 0; i < breakInstructions.size() && index == ~0u; i++)
	{
		if(breakInstructions[i].instIndex == instruction)
			index = i;
	}

	if(index == ~0u || *instAddress[breakInstructions[index].instIndex] != 0xcc)
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: there is no breakpoint at instruction %d", instruction);
		execErrorMessage = execErrorBuffer;
		return false;
	}

	*instAddress[breakInstructions[index].instIndex] = breakInstructions[index].oldOpcode;
	return true;
}